

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O1

int fits_strncasecmp(char *s1,char *s2,size_t n)

{
  char cVar1;
  uint uVar2;
  __int32_t **pp_Var3;
  long lVar4;
  char cVar5;
  bool bVar6;
  
  if (n == 0) {
    return 0;
  }
  pp_Var3 = __ctype_toupper_loc();
  lVar4 = 0;
  do {
    uVar2 = (*pp_Var3)[s1[lVar4]];
    cVar1 = (char)(*pp_Var3)[s2[lVar4]];
    cVar5 = (char)uVar2;
    if (cVar5 < cVar1) {
      return -1;
    }
    if (cVar1 < cVar5) {
      return 1;
    }
    if ((uVar2 & 0xff) == 0) {
      return 0;
    }
    bVar6 = n - 1 != lVar4;
    lVar4 = lVar4 + 1;
  } while (bVar6);
  return 0;
}

Assistant:

int fits_strncasecmp(const char *s1, const char *s2, size_t n)
{
   char c1, c2;

   for (; n-- ;) {
      c1 = toupper( *s1 );
      c2 = toupper( *s2 );

      if (c1 < c2) return(-1);
      if (c1 > c2) return(1);
      if (c1 == 0) return(0);
      s1++;
      s2++;
   }
   return(0);
}